

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_safecopyLiterals(BYTE *op,BYTE *ip,BYTE *iend,BYTE *ilimit_w)

{
  BYTE *pBVar1;
  undefined8 uVar2;
  long lVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  
  if (iend <= ilimit_w) {
    __assert_fail("iend > ilimit_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x201c,
                  "void ZSTD_safecopyLiterals(BYTE *, const BYTE *, const BYTE *const, const BYTE *)"
                 );
  }
  pBVar4 = ip;
  pBVar5 = op;
  if (ip <= ilimit_w) {
    lVar3 = (long)op - (long)ip;
    if (lVar3 < 8) {
      if (-0x10 < lVar3) {
        __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1268,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
    }
    else if (0xffffffffffffffe0 < lVar3 - 0x10U) {
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1270,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    pBVar5 = op + ((long)ilimit_w - (long)ip);
    uVar2 = *(undefined8 *)(ip + 8);
    *(undefined8 *)op = *(undefined8 *)ip;
    *(undefined8 *)(op + 8) = uVar2;
    pBVar4 = ilimit_w;
    if (0x10 < (long)ilimit_w - (long)ip) {
      lVar3 = 0x10;
      do {
        uVar2 = *(undefined8 *)(ip + lVar3 + 8);
        pBVar1 = op + lVar3;
        *(undefined8 *)pBVar1 = *(undefined8 *)(ip + lVar3);
        *(undefined8 *)(pBVar1 + 8) = uVar2;
        uVar2 = *(undefined8 *)(ip + lVar3 + 0x10 + 8);
        *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)(ip + lVar3 + 0x10);
        *(undefined8 *)(pBVar1 + 0x18) = uVar2;
        lVar3 = lVar3 + 0x20;
      } while (pBVar1 + 0x20 < pBVar5);
    }
  }
  for (; pBVar4 < iend; pBVar4 = pBVar4 + 1) {
    *pBVar5 = *pBVar4;
    pBVar5 = pBVar5 + 1;
  }
  return;
}

Assistant:

static void ZSTD_safecopyLiterals(BYTE* op, BYTE const* ip, BYTE const* const iend, BYTE const* ilimit_w) {
    assert(iend > ilimit_w);
    if (ip <= ilimit_w) {
        ZSTD_wildcopy(op, ip, ilimit_w - ip, ZSTD_no_overlap);
        op += ilimit_w - ip;
        ip = ilimit_w;
    }
    while (ip < iend) *op++ = *ip++;
}